

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

Page * __thiscall QToolBoxPrivate::page(QToolBoxPrivate *this,QObject *widget)

{
  Page *pPVar1;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  pointer puVar2;
  
  if (widget != (QObject *)0x0) {
    for (puVar2 = (this->pageList).
                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 != (this->pageList).
                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      pPVar1 = (puVar2->_M_t).
               super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
               ._M_t.
               super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
               .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
      if (pPVar1->widget == (QWidget *)widget) {
        return pPVar1;
      }
    }
  }
  return (Page *)0x0;
}

Assistant:

const QToolBoxPrivate::Page *QToolBoxPrivate::page(const QObject *widget) const
{
    if (!widget)
        return nullptr;

    for (const auto &page : pageList) {
        if (page->widget == widget)
            return page.get();
    }
    return nullptr;
}